

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O3

void Fossilize::hash_variant
               (Hasher *h,VariantDependency dep,VkPhysicalDeviceProperties2 *props,
               VkApplicationInfo *info,void *device_pnext,bool feature_hash)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  VkBaseInStructure *sin_3;
  int *piVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  bool bVar10;
  
  switch(dep) {
  case VendorID:
    if (props == (VkPhysicalDeviceProperties2 *)0x0) break;
    uVar7 = (ulong)(props->properties).vendorID;
    goto LAB_0013c594;
  case MutableDescriptorType:
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x3ba02518) {
        iVar3 = *(int *)((long)device_pnext + 0x10);
        bVar10 = iVar3 != 0;
        if ((feature_hash) && (iVar3 != 0)) {
          h->h = h->h * 0x100000001b3 ^ 0x3ba02518;
          bVar10 = true;
        }
        else if ((feature_hash) && (iVar3 == 0)) {
          return;
        }
        goto LAB_0013c765;
      }
    }
    if (feature_hash) {
      return;
    }
    bVar10 = false;
LAB_0013c765:
    uVar7 = h->h * 0x100000001b3;
    uVar9 = (ulong)bVar10;
    goto LAB_0013c5a2;
  case BindlessUBO:
    piVar4 = (int *)device_pnext;
    if (device_pnext == (void *)0x0) goto LAB_0013c52f;
    do {
      if (*piVar4 == 0x3b9d3ee9) goto LAB_0013c3d7;
      piVar1 = piVar4 + 2;
      piVar4 = *(int **)piVar1;
    } while (*(int **)piVar1 != (int *)0x0);
    piVar4 = (int *)0x0;
LAB_0013c3d7:
    do {
      if (*device_pnext == 0x33) goto LAB_0013c3e9;
      device_pnext = *(void **)((long)device_pnext + 8);
    } while ((int *)device_pnext != (int *)0x0);
    device_pnext = (int *)0x0;
LAB_0013c3e9:
    if ((piVar4 == (int *)0x0) || (bVar10 = true, piVar4[0xe] == 0)) {
      if ((int *)device_pnext == (int *)0x0) goto LAB_0013c52f;
      bVar10 = *(int *)((long)device_pnext + 0x60) != 0;
    }
    if ((!feature_hash) || (bVar10 == false)) goto LAB_0013c5a9;
    h->h = (h->h * 0x100000001b3 ^ 0x3b9d3ee9) * 0x100000001b3 ^ 10;
LAB_0013c528:
    bVar10 = true;
    goto LAB_0013c5b9;
  case BufferDeviceAddress:
    piVar4 = (int *)device_pnext;
    if (device_pnext != (void *)0x0) {
      do {
        if (*piVar4 == 0x3b9eb5e8) goto LAB_0013c4d1;
        piVar1 = piVar4 + 2;
        piVar4 = *(int **)piVar1;
      } while (*(int **)piVar1 != (int *)0x0);
      piVar4 = (int *)0x0;
LAB_0013c4d1:
      do {
        if (*device_pnext == 0x33) goto LAB_0013c4e3;
        device_pnext = *(void **)((long)device_pnext + 8);
      } while ((int *)device_pnext != (int *)0x0);
      device_pnext = (int *)0x0;
LAB_0013c4e3:
      if ((piVar4 == (int *)0x0) || (bVar10 = true, piVar4[4] == 0)) {
        if ((int *)device_pnext == (int *)0x0) goto LAB_0013c52f;
        bVar10 = *(int *)((long)device_pnext + 0xa8) != 0;
      }
      if ((!feature_hash) || (bVar10 == false)) goto LAB_0013c5a9;
      uVar9 = h->h * 0x100000001b3 ^ 0x3b9eb5e8;
LAB_0013c525:
      h->h = uVar9;
      goto LAB_0013c528;
    }
    goto LAB_0013c52f;
  case ApplicationVersion:
    if (info != (VkApplicationInfo *)0x0) {
      uVar7 = (ulong)info->applicationVersion;
      goto LAB_0013c594;
    }
    break;
  case EngineVersion:
    if (info != (VkApplicationInfo *)0x0) {
      uVar7 = (ulong)info->engineVersion;
      goto LAB_0013c594;
    }
    break;
  case ApplicationVersionMajor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar5 = info->applicationVersion;
LAB_0013c56a:
      uVar7 = (ulong)(uVar5 >> 0x16);
      goto LAB_0013c594;
    }
    break;
  case ApplicationVersionMinor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar5 = info->applicationVersion;
LAB_0013c577:
      uVar7 = (ulong)(uVar5 >> 0xc & 0x3ff);
      goto LAB_0013c594;
    }
    break;
  case ApplicationVersionPatch:
    if (info != (VkApplicationInfo *)0x0) {
      uVar5 = info->applicationVersion;
LAB_0013c58a:
      uVar7 = (ulong)(uVar5 & 0xfff);
      goto LAB_0013c594;
    }
    break;
  case EngineVersionMajor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar5 = info->engineVersion;
      goto LAB_0013c56a;
    }
    break;
  case EngineVersionMinor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar5 = info->engineVersion;
      goto LAB_0013c577;
    }
    break;
  case EngineVersionPatch:
    if (info != (VkApplicationInfo *)0x0) {
      uVar5 = info->engineVersion;
      goto LAB_0013c58a;
    }
    break;
  case ApplicationName:
    if (info == (VkApplicationInfo *)0x0) {
      pbVar8 = (byte *)0x0;
    }
    else {
      pbVar8 = (byte *)info->pApplicationName;
    }
    pbVar6 = (byte *)0x15c699;
    if (pbVar8 != (byte *)0x0) {
      pbVar6 = pbVar8;
    }
    uVar9 = h->h * 0x100000001b3 ^ 0xff;
    h->h = uVar9;
    bVar2 = *pbVar6;
    while (bVar2 != 0) {
      pbVar6 = pbVar6 + 1;
      uVar9 = uVar9 * 0x100000001b3 ^ (ulong)bVar2;
      h->h = uVar9;
      bVar2 = *pbVar6;
    }
    return;
  case EngineName:
    if (info == (VkApplicationInfo *)0x0) {
      pbVar8 = (byte *)0x0;
    }
    else {
      pbVar8 = (byte *)info->pEngineName;
    }
    pbVar6 = (byte *)0x15c699;
    if (pbVar8 != (byte *)0x0) {
      pbVar6 = pbVar8;
    }
    uVar9 = h->h * 0x100000001b3 ^ 0xff;
    h->h = uVar9;
    bVar2 = *pbVar6;
    while (bVar2 != 0) {
      pbVar6 = pbVar6 + 1;
      uVar9 = uVar9 * 0x100000001b3 ^ (ulong)bVar2;
      h->h = uVar9;
      bVar2 = *pbVar6;
    }
    return;
  case FragmentShadingRate:
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x3b9e3cd3) {
        bVar10 = true;
        if ((*(int *)((long)device_pnext + 0x18) == 0) && (*(int *)((long)device_pnext + 0x10) == 0)
           ) {
          bVar10 = *(int *)((long)device_pnext + 0x14) != 0;
        }
        if ((feature_hash) && (bVar10)) {
          uVar9 = h->h * 0x100000001b3 ^ 0x3b9e3cd3;
        }
        else {
          if ((~feature_hash & 1U) == 0 && !bVar10) {
            return;
          }
          uVar9 = h->h;
        }
        uVar9 = (ulong)(*(int *)((long)device_pnext + 0x10) != 0) ^
                ((ulong)(*(int *)((long)device_pnext + 0x18) != 0) ^ uVar9 * 0x100000001b3) *
                0x100000001b3;
        uVar7 = (ulong)(*(int *)((long)device_pnext + 0x14) != 0);
        goto LAB_0013c7ef;
      }
    }
    if (feature_hash) {
      return;
    }
    uVar9 = h->h * 0x366000002e329;
    uVar7 = 0;
LAB_0013c7ef:
    uVar9 = uVar9 * 0x100000001b3;
    goto LAB_0013c5a2;
  case DynamicRendering:
    piVar4 = (int *)device_pnext;
    if (device_pnext != (void *)0x0) {
      do {
        if (*piVar4 == 0x3b9b75e3) goto LAB_0013c45f;
        piVar1 = piVar4 + 2;
        piVar4 = *(int **)piVar1;
      } while (*(int **)piVar1 != (int *)0x0);
      piVar4 = (int *)0x0;
LAB_0013c45f:
      do {
        if (*device_pnext == 0x35) goto LAB_0013c471;
        device_pnext = *(void **)((long)device_pnext + 8);
      } while ((int *)device_pnext != (int *)0x0);
      device_pnext = (int *)0x0;
LAB_0013c471:
      if ((piVar4 == (int *)0x0) || (bVar10 = true, piVar4[4] == 0)) {
        if ((int *)device_pnext == (int *)0x0) goto LAB_0013c52f;
        bVar10 = *(int *)((long)device_pnext + 0x40) != 0;
      }
      if ((feature_hash) && (bVar10 != false)) {
        uVar9 = h->h * 0x100000001b3 ^ 0x3b9b75e3;
        goto LAB_0013c525;
      }
LAB_0013c5a9:
      if ((~feature_hash & 1U) == 0 && bVar10 == false) {
        return;
      }
      goto LAB_0013c5b9;
    }
LAB_0013c52f:
    if (feature_hash) {
      return;
    }
    bVar10 = false;
LAB_0013c5b9:
    uVar7 = h->h * 0x100000001b3;
    uVar9 = (ulong)bVar10;
LAB_0013c7aa:
    uVar9 = uVar9 ^ uVar7;
    goto LAB_0013c5a5;
  case DescriptorBuffer:
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x3b9f9c62) {
        bVar10 = true;
        if (*(int *)((long)device_pnext + 0x10) == 0) {
          bVar10 = *(int *)((long)device_pnext + 0x1c) != 0;
        }
        if ((feature_hash) && (bVar10)) {
          uVar9 = h->h * 0x100000001b3 ^ 0x3b9f9c62;
        }
        else {
          if ((~feature_hash & 1U) == 0 && !bVar10) {
            return;
          }
          uVar9 = h->h;
        }
        uVar9 = (ulong)(*(int *)((long)device_pnext + 0x10) != 0) ^ uVar9 * 0x100000001b3;
        uVar7 = (ulong)(*(int *)((long)device_pnext + 0x1c) != 0);
        goto LAB_0013c7a6;
      }
    }
    if (feature_hash) {
      return;
    }
    uVar9 = h->h * 0x100000001b3;
    uVar7 = 0;
LAB_0013c7a6:
    uVar9 = uVar9 * 0x100000001b3;
    goto LAB_0013c7aa;
  default:
    return;
  }
  uVar7 = 0;
LAB_0013c594:
  uVar9 = h->h * 0x100000001b3;
LAB_0013c5a2:
  uVar9 = uVar9 ^ uVar7;
LAB_0013c5a5:
  h->h = uVar9;
  return;
}

Assistant:

static void hash_variant(Hasher &h, VariantDependency dep,
                         const VkPhysicalDeviceProperties2 *props,
                         const VkApplicationInfo *info,
                         const void *device_pnext,
                         bool feature_hash)
{
	const VkApplicationInfo default_app_info = { VK_STRUCTURE_TYPE_APPLICATION_INFO };
	bool hash_enabled = true;

	if (!info)
		info = &default_app_info;

	switch (dep)
	{
	case VariantDependency::VendorID:
		h.u32(props ? props->properties.vendorID : 0);
		break;

	case VariantDependency::MutableDescriptorType:
	{
		auto *mut = find_pnext<VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT,
				device_pnext);

		bool enabled = mut && mut->mutableDescriptorType;

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::BufferDeviceAddress:
	{
		auto *bda = find_pnext<VkPhysicalDeviceBufferDeviceAddressFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES,
				device_pnext);
		auto *features12 = find_pnext<VkPhysicalDeviceVulkan12Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,
				device_pnext);

		bool enabled = (bda && bda->bufferDeviceAddress) ||
		               (features12 && features12->bufferDeviceAddress);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::FragmentShadingRate:
	{
		auto *vrs = find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR, device_pnext);

		bool enabled = vrs && (vrs->attachmentFragmentShadingRate ||
		                       vrs->pipelineFragmentShadingRate ||
		                       vrs->primitiveFragmentShadingRate);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR);
		}

		if (hash_enabled)
		{
			h.u32(uint32_t(vrs && vrs->attachmentFragmentShadingRate));
			h.u32(uint32_t(vrs && vrs->pipelineFragmentShadingRate));
			h.u32(uint32_t(vrs && vrs->primitiveFragmentShadingRate));
		}
		break;
	}

	case VariantDependency::DynamicRendering:
	{
		auto *dynamic_rendering = find_pnext<VkPhysicalDeviceDynamicRenderingFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES, device_pnext);
		auto *features13 = find_pnext<VkPhysicalDeviceVulkan13Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES, device_pnext);
		bool enabled = (dynamic_rendering && dynamic_rendering->dynamicRendering) ||
		               (features13 && features13->dynamicRendering);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::BindlessUBO:
	{
		auto *indexing = find_pnext<VkPhysicalDeviceDescriptorIndexingFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES,
				device_pnext);
		auto *features12 = find_pnext<VkPhysicalDeviceVulkan12Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,
				device_pnext);
		bool enabled = (indexing && indexing->descriptorBindingUniformBufferUpdateAfterBind) ||
		               (features12 && features12->descriptorBindingUniformBufferUpdateAfterBind);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
			{
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES);
				// 10th feature element.
				// Just arbitrary to distinguish potential hashing on different
				// sub-features of this struct at some other point.
				h.u32(10);
			}
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::DescriptorBuffer:
	{
		auto *descriptor_buffer = find_pnext<VkPhysicalDeviceDescriptorBufferFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT,
				device_pnext);
		bool enabled = descriptor_buffer && (descriptor_buffer->descriptorBuffer ||
		                                     descriptor_buffer->descriptorBufferPushDescriptors);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT);
		}

		if (hash_enabled)
		{
			h.u32(uint32_t(descriptor_buffer && descriptor_buffer->descriptorBuffer));
			h.u32(uint32_t(descriptor_buffer && descriptor_buffer->descriptorBufferPushDescriptors));
			// The other feature bits are highly unlikely to ever affect
			// pipeline construction in application in any meaningful way.
		}
		break;
	}

	case VariantDependency::ApplicationVersion:
		h.u32(info->applicationVersion);
		break;

	case VariantDependency::ApplicationVersionMajor:
		h.u32(VK_VERSION_MAJOR(info->applicationVersion));
		break;

	case VariantDependency::ApplicationVersionMinor:
		h.u32(VK_VERSION_MINOR(info->applicationVersion));
		break;

	case VariantDependency::ApplicationVersionPatch:
		h.u32(VK_VERSION_PATCH(info->applicationVersion));
		break;

	case VariantDependency::EngineVersion:
		h.u32(info->engineVersion);
		break;

	case VariantDependency::EngineVersionMajor:
		h.u32(VK_VERSION_MAJOR(info->engineVersion));
		break;

	case VariantDependency::EngineVersionMinor:
		h.u32(VK_VERSION_MINOR(info->engineVersion));
		break;

	case VariantDependency::EngineVersionPatch:
		h.u32(VK_VERSION_PATCH(info->engineVersion));
		break;

	case VariantDependency::ApplicationName:
		h.string(info->pApplicationName ? info->pApplicationName : "");
		break;

	case VariantDependency::EngineName:
		h.string(info->pEngineName ? info->pEngineName : "");
		break;

	default:
		break;
	}
}